

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ComputeSigPointRequest::ComputeSigPointRequest(ComputeSigPointRequest *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  ComputeSigPointRequest *local_10;
  ComputeSigPointRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ComputeSigPointRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ComputeSigPointRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::ComputeSigPointRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ComputeSigPointRequest_01b457f8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->message_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->is_hashed_ = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->nonce_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->schnorr_pubkey_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  CollectFieldName();
  return;
}

Assistant:

ComputeSigPointRequest() {
    CollectFieldName();
  }